

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_pool.hpp
# Opt level: O2

void __thiscall iutest::detail::iuPool::~iuPool(iuPool *this)

{
  iuIObject *piVar1;
  iterator __position;
  
  __position._M_current =
       (this->m_pool).
       super__Vector_base<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  while (__position._M_current !=
         (this->m_pool).
         super__Vector_base<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    piVar1 = *__position._M_current;
    __position = std::
                 vector<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>::
                 erase(&this->m_pool,__position._M_current);
    if (piVar1 != (iuIObject *)0x0) {
      (*piVar1->_vptr_iuIObject[1])(piVar1);
    }
  }
  std::_Vector_base<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>::
  ~_Vector_base((_Vector_base<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>
                 *)this);
  return;
}

Assistant:

~iuPool()
    {
        // すべて解放する
        for( pool::iterator it=m_pool.begin(); it != m_pool.end(); )
        {
            value_ptr p = *it;
            it = m_pool.erase(it);
            delete p;
        }
    }